

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_msgclr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  code *func;
  TCGTemp *local_18;
  long local_10;
  
  if ((ctx->pr == false) && (ctx->hv != false)) {
    tcg_ctx = ctx->uc->tcg_ctx;
    local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_10 = (long)&tcg_ctx->pool_cur +
               *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    if ((ctx->insns_flags & 0x200000000000) == 0) {
      func = helper_msgclr_ppc64;
    }
    else {
      func = helper_book3s_msgclr_ppc64;
    }
    tcg_gen_callN_ppc64(tcg_ctx,func,(TCGTemp *)0x0,2,&local_18);
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_msgclr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_HV;
    if (is_book3s_arch2x(ctx)) {
        gen_helper_book3s_msgclr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rB(ctx->opcode)]);
    } else {
        gen_helper_msgclr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rB(ctx->opcode)]);
    }
}